

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantag.cpp
# Opt level: O2

string * __thiscall
YAML::ScanTagSuffix_abi_cxx11_(string *__return_storage_ptr__,YAML *this,Stream *INPUT)

{
  bool bVar1;
  int n;
  RegEx *this_00;
  ParserException *this_01;
  allocator local_51;
  Mark local_50;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    bVar1 = Stream::operator_cast_to_bool((Stream *)this);
    if (!bVar1) break;
    this_00 = Exp::Tag();
    n = RegEx::Match(this_00,(Stream *)this);
    if (n < 1) break;
    Stream::get_abi_cxx11_(&local_40,(Stream *)this,n);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    return __return_storage_ptr__;
  }
  this_01 = (ParserException *)__cxa_allocate_exception(0x40);
  local_50._0_8_ = *(undefined8 *)(this + 8);
  local_50.column = *(int *)(this + 0x10);
  std::__cxx11::string::string((string *)&local_40,"tag handle with no suffix",&local_51);
  ParserException::ParserException(this_01,&local_50,&local_40);
  __cxa_throw(this_01,&ParserException::typeinfo,BadConversion::~BadConversion);
}

Assistant:

const std::string ScanTagSuffix(Stream& INPUT) {
  std::string tag;

  while (INPUT) {
    int n = Exp::Tag().Match(INPUT);
    if (n <= 0)
      break;

    tag += INPUT.get(n);
  }

  if (tag.empty())
    throw ParserException(INPUT.mark(), ErrorMsg::TAG_WITH_NO_SUFFIX);

  return tag;
}